

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pray.c
# Opt level: O0

int in_trouble(void)

{
  boolean bVar1;
  int iVar2;
  obj *poVar3;
  int local_24;
  int local_20;
  int count;
  int j;
  int i;
  obj *otmp;
  
  local_24 = 0;
  if (u.uprops[0x21].intrinsic != 0) {
    return 0xd;
  }
  if (u.uprops[0x3a].intrinsic != 0) {
    return 0xc;
  }
  if (u.uprops[0x22].intrinsic != 0) {
    return 0xb;
  }
  if ((u.utrap != 0) && (u.utraptype == 3)) {
    return 10;
  }
  if (u.uprops[0x1d].intrinsic != 0) {
    return 9;
  }
  if (2 < u.uhs) {
    return 8;
  }
  if (u.umonnum == u.umonster) {
    if (u.uhp < 6) {
      return 7;
    }
    if (u.uhp * 7 <= u.uhpmax) {
      return 7;
    }
  }
  else if ((u.mh < 6) || (u.mh * 7 <= u.mhmax)) {
    return 7;
  }
  if (u.ulycn < 0) {
    iVar2 = near_capacity();
    if ((iVar2 < 4) || ((int)u.amax.a[0] - (int)u.acurr.a[0] < 4)) {
      for (count = -1; count < 2; count = count + 1) {
        for (local_20 = -1; local_20 < 2; local_20 = local_20 + 1) {
          if (((count != 0) || (local_20 != 0)) &&
             (((u.ux + count < 1 ||
               ((((0x4f < u.ux + count || (u.uy + local_20 < 0)) || (0x14 < u.uy + local_20)) ||
                (level->locations[u.ux + count][u.uy + local_20].typ < '\x11')))) ||
              ((bVar1 = blocked_boulder(count,local_20), bVar1 != '\0' &&
               (((youmonst.data)->mflags2 & 0x8000000) == 0)))))) {
            local_24 = local_24 + 1;
          }
        }
      }
      if (((local_24 == 8) && (u.uprops[0x3e].intrinsic == 0)) &&
         ((u.uprops[0x3e].extrinsic == 0 && (((youmonst.data)->mflags1 & 8) == 0)))) {
        otmp._4_4_ = 4;
      }
      else if ((((uarmf == (obj *)0x0) || (uarmf->otyp != 0x9c)) ||
               ((*(uint *)&uarmf->field_0x4a & 1) == 0)) &&
              ((poVar3 = stuck_ring(uleft,0xaa), poVar3 == (obj *)0x0 &&
               (poVar3 = stuck_ring(uright,0xaa), poVar3 == (obj *)0x0)))) {
        if ((((youmonst.data)->mflags1 & 0x2000) != 0) || (iVar2 = freehand(), iVar2 == 0)) {
          iVar2 = welded(uwep);
          if (iVar2 != 0) {
            return 2;
          }
          if (((u.umonnum != u.umonster) && (((youmonst.data)->mflags1 & 0x2000) != 0)) &&
             (((u.uprops[0x3d].intrinsic == 0 && (u.uprops[0x3d].extrinsic == 0)) ||
              ((poVar3 = unchanger(), poVar3 != (obj *)0x0 &&
               ((*(uint *)&poVar3->field_0x4a & 1) != 0)))))) {
            return 2;
          }
        }
        if (((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) ||
           ((*(uint *)&ublindf->field_0x4a & 1) == 0)) {
          if (uball == (obj *)0x0) {
            if ((((uarmg == (obj *)0x0) || (uarmg->otyp != 0x90)) ||
                ((*(uint *)&uarmg->field_0x4a & 1) == 0)) &&
               (((uarmf == (obj *)0x0 || (uarmf->otyp != 0x9b)) ||
                ((*(uint *)&uarmf->field_0x4a & 1) == 0)))) {
              poVar3 = worst_cursed_item();
              if (poVar3 == (obj *)0x0) {
                if ((((u.usteed == (monst *)0x0) ||
                     (poVar3 = which_armor(u.usteed,0x100000), poVar3 == (obj *)0x0)) ||
                    (poVar3->otyp != 0xf0)) || ((*(uint *)&poVar3->field_0x4a & 1) == 0)) {
                  if ((u.uprops[0x1e].intrinsic < 2) || (((youmonst.data)->mflags1 & 0x1000) != 0))
                  {
                    for (count = 0; count < 6; count = count + 1) {
                      if (u.acurr.a[count] < u.amax.a[count]) {
                        return -6;
                      }
                    }
                    if (((u.uprops[0x20].intrinsic == 0) && (u.uprops[0x20].extrinsic == 0)) ||
                       (u.usteed != (monst *)0x0)) {
                      if (u.uhs < 2) {
                        if (u.uprops[0x1b].intrinsic == 0) {
                          if (u.uprops[0x1c].intrinsic == 0) {
                            if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0))
                               || ((u.umonnum != u.umonster &&
                                   (bVar1 = dmgtype(youmonst.data,0x24), bVar1 != '\0')))) {
                              otmp._4_4_ = 0;
                            }
                            else {
                              otmp._4_4_ = -0xb;
                            }
                          }
                          else {
                            otmp._4_4_ = -10;
                          }
                        }
                        else {
                          otmp._4_4_ = -9;
                        }
                      }
                      else {
                        otmp._4_4_ = -8;
                      }
                    }
                    else {
                      otmp._4_4_ = -7;
                    }
                  }
                  else {
                    otmp._4_4_ = -5;
                  }
                }
                else {
                  otmp._4_4_ = -4;
                }
              }
              else {
                otmp._4_4_ = -3;
              }
            }
            else {
              otmp._4_4_ = -2;
            }
          }
          else {
            otmp._4_4_ = -1;
          }
        }
        else {
          otmp._4_4_ = 1;
        }
      }
      else {
        otmp._4_4_ = 3;
      }
    }
    else {
      otmp._4_4_ = 5;
    }
  }
  else {
    otmp._4_4_ = 6;
  }
  return otmp._4_4_;
}

Assistant:

int in_trouble(void)
{
	struct obj *otmp;
	int i, j, count=0;

	/*
	 * major troubles
	 */
	if (Stoned) return TROUBLE_STONED;
	if (Slimed) return TROUBLE_SLIMED;
	if (Strangled) return TROUBLE_STRANGLED;
	if (u.utrap && u.utraptype == TT_LAVA) return TROUBLE_LAVA;
	if (Sick) return TROUBLE_SICK;
	if (u.uhs >= WEAK) return TROUBLE_STARVING;
	if (Upolyd ? (u.mh <= 5 || u.mh*7 <= u.mhmax) :
		(u.uhp <= 5 || u.uhp*7 <= u.uhpmax)) return TROUBLE_HIT;
	if (u.ulycn >= LOW_PM) return TROUBLE_LYCANTHROPE;
	if (near_capacity() >= EXT_ENCUMBER && AMAX(A_STR)-ABASE(A_STR) > 3)
		return TROUBLE_COLLAPSING;

	for (i= -1; i<=1; i++) for (j= -1; j<=1; j++) {
		if (!i && !j) continue;
		if (!isok(u.ux+i, u.uy+j) || IS_ROCK(level->locations[u.ux+i][u.uy+j].typ)
		    || (blocked_boulder(i,j) && !throws_rocks(youmonst.data)))
			count++;
	}
	if (count == 8 && !Passes_walls)
		return TROUBLE_STUCK_IN_WALL;

	if (Cursed_obj(uarmf, LEVITATION_BOOTS) ||
		stuck_ring(uleft, RIN_LEVITATION) ||
		stuck_ring(uright, RIN_LEVITATION))
		return TROUBLE_CURSED_LEVITATION;
	if (nohands(youmonst.data) || !freehand()) {
	    /* for bag/box access [cf use_container()]...
	       make sure it's a case that we know how to handle;
	       otherwise "fix all troubles" would get stuck in a loop */
	    if (welded(uwep)) return TROUBLE_UNUSEABLE_HANDS;
	    if (Upolyd && nohands(youmonst.data) && (!Unchanging ||
		    ((otmp = unchanger()) != 0 && otmp->cursed)))
		return TROUBLE_UNUSEABLE_HANDS;
	}
	if (Blindfolded && ublindf->cursed) return TROUBLE_CURSED_BLINDFOLD;

	/*
	 * minor troubles
	 */
	if (Punished) return TROUBLE_PUNISHED;
	if (Cursed_obj(uarmg, GAUNTLETS_OF_FUMBLING) ||
		Cursed_obj(uarmf, FUMBLE_BOOTS))
	    return TROUBLE_FUMBLING;
	if (worst_cursed_item()) return TROUBLE_CURSED_ITEMS;
	if (u.usteed) {	/* can't voluntarily dismount from a cursed saddle */
	    otmp = which_armor(u.usteed, W_SADDLE);
	    if (Cursed_obj(otmp, SADDLE)) return TROUBLE_SADDLE;
	}

	if (Blinded > 1 && haseyes(youmonst.data)) return TROUBLE_BLIND;
	for (i=0; i<A_MAX; i++)
	    if (ABASE(i) < AMAX(i)) return TROUBLE_POISONED;
	if (Wounded_legs && !u.usteed)
		return TROUBLE_WOUNDED_LEGS;
	if (u.uhs >= HUNGRY) return TROUBLE_HUNGRY;
	if (HStun) return TROUBLE_STUNNED;
	if (HConfusion) return TROUBLE_CONFUSED;
	if (Hallucination) return TROUBLE_HALLUCINATION;
	return 0;
}